

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void string_suite::run(void)

{
  test_empty();
  test_space();
  test_alpha();
  test_alpha_bravo();
  test_escape_quote();
  test_escape_reverse_solidus();
  test_escape_solidus();
  test_escape_backspace();
  test_escape_formfeed();
  test_escape_newline();
  test_escape_carriage_return();
  test_escape_tab();
  test_escape_unicode_one();
  test_escape_unicode_a();
  test_escape_unicode_0123();
  test_escape_unicode_4567();
  test_escape_unicode_89AB();
  test_escape_unicode_CDEF();
  fail_escape_unicode_missing_one();
  fail_escape_unicode_missing_two();
  fail_escape_unicode_missing_three();
  fail_escape_unicode_missing_four();
  fail_escape_unicode_eof();
  fail_escape_unicode_eof_one();
  fail_escape_unicode_eof_two();
  fail_escape_unicode_eof_three();
  fail_escape_unicode_eof_four();
  fail_escape();
  fail_begin();
  fail_as_int();
  fail_as_float();
  return;
}

Assistant:

void run()
{
    test_empty();
    test_space();
    test_alpha();
    test_alpha_bravo();
    test_escape_quote();
    test_escape_reverse_solidus();
    test_escape_solidus();
    test_escape_backspace();
    test_escape_formfeed();
    test_escape_newline();
    test_escape_carriage_return();
    test_escape_tab();
    test_escape_unicode_one();
    test_escape_unicode_a();
    test_escape_unicode_0123();
    test_escape_unicode_4567();
    test_escape_unicode_89AB();
    test_escape_unicode_CDEF();
    fail_escape_unicode_missing_one();
    fail_escape_unicode_missing_two();
    fail_escape_unicode_missing_three();
    fail_escape_unicode_missing_four();
    fail_escape_unicode_eof();
    fail_escape_unicode_eof_one();
    fail_escape_unicode_eof_two();
    fail_escape_unicode_eof_three();
    fail_escape_unicode_eof_four();
    fail_escape();
    fail_begin();
    fail_as_int();
    fail_as_float();
}